

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

OBJ_DATA * new_obj(void)

{
  OBJ_DATA *__s;
  
  if (obj_free == (OBJ_DATA *)0x0) {
    __s = (OBJ_DATA *)operator_new(0x158);
  }
  else {
    __s = obj_free;
    obj_free = obj_free->next;
  }
  memset(__s,0,0x158);
  __s->valid = true;
  return __s;
}

Assistant:

OBJ_DATA *new_obj(void)
{
	static OBJ_DATA obj_zero;
	OBJ_DATA *obj;

	if (obj_free == nullptr)
	{
		obj = new OBJ_DATA;
	}
	else
	{
		obj = obj_free;
		obj_free = obj_free->next;
	}

	*obj = obj_zero;

	obj->valid = true;
	return obj;
}